

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::EscapeForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *str,bool makeVars,
          bool forEcho,bool useWatcomQuote)

{
  pointer pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  const_iterator cVar6;
  cmState *pcVar7;
  uint flags;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1c2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1c1;
  long *local_1c0;
  long local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined2 *local_190;
  undefined8 local_188;
  undefined2 local_180 [8];
  undefined2 *local_170;
  undefined8 local_168;
  undefined2 local_160;
  undefined1 local_15e;
  undefined2 *local_150;
  undefined8 local_148;
  undefined2 local_140;
  undefined1 local_13e;
  undefined2 *local_130;
  undefined8 local_128;
  undefined2 local_120 [8];
  undefined2 *local_110;
  undefined8 local_108;
  undefined2 local_100;
  undefined1 local_fe;
  undefined2 *local_f0;
  undefined8 local_e8;
  undefined2 local_e0;
  undefined1 local_de;
  undefined2 *local_d0;
  undefined8 local_c8;
  undefined2 local_c0;
  undefined1 local_be;
  undefined2 *local_b0;
  undefined8 local_a8;
  undefined2 local_a0;
  undefined1 local_9e;
  undefined2 *local_90;
  undefined8 local_88;
  undefined2 local_80;
  undefined1 local_7e;
  undefined4 *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined1 uStack_5c;
  long *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  
  if (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ ==
      '\0') {
    iVar5 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                                 shellOperators_abi_cxx11_);
    if (iVar5 != 0) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      local_1b0.field_2._M_allocated_capacity._0_2_ = 0x3c;
      local_1b0._M_string_length = 1;
      local_190 = local_180;
      local_180[0] = 0x3e;
      local_188 = 1;
      local_170 = &local_160;
      local_160 = 0x3c3c;
      local_168 = 2;
      local_15e = 0;
      local_150 = &local_140;
      local_140 = 0x3e3e;
      local_148 = 2;
      local_13e = 0;
      local_130 = local_120;
      local_120[0] = 0x7c;
      local_128 = 1;
      local_110 = &local_100;
      local_100 = 0x7c7c;
      local_108 = 2;
      local_fe = 0;
      local_f0 = &local_e0;
      local_e0 = 0x2626;
      local_e8 = 2;
      local_de = 0;
      local_d0 = &local_c0;
      local_c0 = 0x3e26;
      local_c8 = 2;
      local_be = 0;
      local_b0 = &local_a0;
      local_a0 = 0x3e31;
      local_a8 = 2;
      local_9e = 0;
      local_90 = &local_80;
      local_80 = 0x3e32;
      local_88 = 2;
      local_7e = 0;
      local_70 = &local_60;
      local_60 = 0x31263e32;
      local_68 = 4;
      uStack_5c = 0;
      local_1c0 = (long *)&local_40;
      local_40 = 0x32263e31;
      local_48 = 4;
      local_3c = 0;
      __l._M_len = 0xc;
      __l._M_array = &local_1b0;
      local_50 = local_1c0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
               shellOperators_abi_cxx11_,__l,&local_1c1,&local_1c2);
      local_1b8 = -0x180;
      do {
        if (local_1c0 != (long *)local_1c0[-2]) {
          operator_delete((long *)local_1c0[-2],*local_1c0 + 1);
        }
        local_1c0 = local_1c0 + -4;
        local_1b8 = local_1b8 + 0x20;
      } while (local_1b8 != 0);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                          shellOperators_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                           shellOperators_abi_cxx11_);
    }
  }
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                    shellOperators_abi_cxx11_,str);
  if (cVar6._M_node ==
      (_Base_ptr)
      (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ + 8)
     ) {
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseWindowsVSIDE(pcVar7);
    uVar4 = 2;
    if (!bVar3) {
      uVar4 = this->LinkScriptShell ^ 1;
    }
    flags = uVar4 | 0x40;
    if (!makeVars) {
      flags = uVar4;
    }
    uVar4 = flags | 4;
    if (!forEcho) {
      uVar4 = flags;
    }
    uVar2 = uVar4 | 0x80;
    if (!useWatcomQuote) {
      uVar2 = uVar4;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseWatcomWMake(pcVar7);
    uVar4 = uVar2 | 8;
    if (!bVar3) {
      uVar4 = uVar2;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseMinGWMake(pcVar7);
    uVar2 = uVar4 | 0x10;
    if (!bVar3) {
      uVar2 = uVar4;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseNMake(pcVar7);
    uVar4 = uVar2 | 0x20;
    if (!bVar3) {
      uVar4 = uVar2;
    }
    pcVar7 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseWindowsShell(pcVar7);
    uVar2 = uVar4 | 0x100;
    if (bVar3) {
      uVar2 = uVar4;
    }
    Shell__GetArgument_abi_cxx11_
              (__return_storage_ptr__,(cmOutputConverter *)(str->_M_dataplus)._M_p,
               (char *)(ulong)uVar2,flags);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(const std::string& str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return str;
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell__GetArgument(str.c_str(), flags);
}